

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O2

MV clamp_mv_to_umv_border_sb(MACROBLOCKD *xd,MV *src_mv,int bw,int bh,int ss_x,int ss_y)

{
  ushort uVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  
  bVar8 = 1 - (char)ss_y;
  bVar3 = 1 - (char)ss_x;
  iVar6 = (xd->mb_to_left_edge << (bVar3 & 0x1f)) + bw * -0x10 + -0x40;
  iVar5 = bw * 0x10 + (xd->mb_to_right_edge << (bVar3 & 0x1f)) + 0x30;
  iVar7 = (xd->mb_to_top_edge << (bVar8 & 0x1f)) + bh * -0x10 + -0x40;
  iVar4 = (int)(short)(src_mv->col << (bVar3 & 0x1f));
  if (iVar4 < iVar5) {
    iVar5 = iVar4;
  }
  iVar2 = bh * 0x10 + (xd->mb_to_bottom_edge << (bVar8 & 0x1f)) + 0x30;
  if (iVar4 < iVar6) {
    iVar5 = iVar6;
  }
  iVar4 = (int)(short)(src_mv->row << (bVar8 & 0x1f));
  if (iVar4 < iVar2) {
    iVar2 = iVar4;
  }
  uVar1 = (ushort)iVar2;
  if (iVar4 < iVar7) {
    uVar1 = (ushort)iVar7;
  }
  return (MV)((uint)uVar1 | iVar5 << 0x10);
}

Assistant:

static inline MV clamp_mv_to_umv_border_sb(const MACROBLOCKD *xd,
                                           const MV *src_mv, int bw, int bh,
                                           int ss_x, int ss_y) {
  // If the MV points so far into the UMV border that no visible pixels
  // are used for reconstruction, the subpel part of the MV can be
  // discarded and the MV limited to 16 pixels with equivalent results.
  const int spel_left = (AOM_INTERP_EXTEND + bw) << SUBPEL_BITS;
  const int spel_right = spel_left - SUBPEL_SHIFTS;
  const int spel_top = (AOM_INTERP_EXTEND + bh) << SUBPEL_BITS;
  const int spel_bottom = spel_top - SUBPEL_SHIFTS;
  MV clamped_mv = { (int16_t)(src_mv->row * (1 << (1 - ss_y))),
                    (int16_t)(src_mv->col * (1 << (1 - ss_x))) };
  assert(ss_x <= 1);
  assert(ss_y <= 1);
  const SubpelMvLimits mv_limits = {
    xd->mb_to_left_edge * (1 << (1 - ss_x)) - spel_left,
    xd->mb_to_right_edge * (1 << (1 - ss_x)) + spel_right,
    xd->mb_to_top_edge * (1 << (1 - ss_y)) - spel_top,
    xd->mb_to_bottom_edge * (1 << (1 - ss_y)) + spel_bottom
  };

  clamp_mv(&clamped_mv, &mv_limits);

  return clamped_mv;
}